

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicRegExp(JSContext *ctx)

{
  JSValue obj_00;
  JSValue obj_01;
  JSValue proto;
  JSContext *in_RDI;
  JSValue JVar1;
  JSValue obj;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar2;
  int len;
  JSCFunctionListEntry *in_stack_ffffffffffffff98;
  JSContext *tab;
  JSContext *in_stack_ffffffffffffffa0;
  JSContext *ctx_00;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  int64_t local_40;
  JSValueUnion local_28;
  int64_t local_20;
  
  JS_AddIntrinsicRegExpCompiler(in_RDI);
  uVar2 = SUB84(in_RDI->class_proto,0);
  len = (int)((ulong)in_RDI->class_proto >> 0x20);
  JVar1 = JS_NewObject((JSContext *)0x11f21b);
  local_28 = JVar1.u;
  *(JSValueUnion *)(CONCAT44(len,uVar2) + 0x120) = local_28;
  local_20 = JVar1.tag;
  *(int64_t *)(CONCAT44(len,uVar2) + 0x128) = local_20;
  obj_00.tag = (int64_t)in_stack_ffffffffffffffb0.ptr;
  obj_00.u.ptr = in_stack_ffffffffffffffa8.ptr;
  JS_SetPropertyFunctionList(in_stack_ffffffffffffffa0,obj_00,in_stack_ffffffffffffff98,len);
  proto.tag = in_stack_ffffffffffffffb8;
  proto.u.ptr = in_stack_ffffffffffffffb0.ptr;
  JVar1 = JS_NewGlobalCConstructor
                    ((JSContext *)in_stack_ffffffffffffffa8.ptr,(char *)in_stack_ffffffffffffffa0,
                     (JSCFunction *)in_stack_ffffffffffffff98,len,proto);
  tab = in_RDI;
  JVar1 = JS_DupValue(in_RDI,JVar1);
  local_40 = JVar1.tag;
  (tab->regexp_ctor).u = JVar1.u;
  (tab->regexp_ctor).tag = local_40;
  obj_01.tag = (int64_t)in_stack_ffffffffffffffb0.ptr;
  obj_01.u.ptr = in_stack_ffffffffffffffa8.ptr;
  JS_SetPropertyFunctionList(in_stack_ffffffffffffffa0,obj_01,(JSCFunctionListEntry *)tab,len);
  ctx_00 = (JSContext *)in_RDI->class_proto;
  JVar1.tag._0_4_ = uVar2;
  JVar1.u = (JSValueUnion)in_stack_ffffffffffffff88;
  JVar1.tag._4_4_ = len;
  JVar1 = JS_NewObjectProto((JSContext *)0x11f356,JVar1);
  ctx_00[1].native_error_proto[1].tag = (int64_t)JVar1.u;
  ctx_00[1].native_error_proto[2].u = (JSValueUnion)JVar1.tag;
  JS_SetPropertyFunctionList(ctx_00,JVar1,(JSCFunctionListEntry *)tab,len);
  return;
}

Assistant:

void JS_AddIntrinsicRegExp(JSContext *ctx)
{
    JSValueConst obj;

    JS_AddIntrinsicRegExpCompiler(ctx);

    ctx->class_proto[JS_CLASS_REGEXP] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_REGEXP], js_regexp_proto_funcs,
                               countof(js_regexp_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "RegExp", js_regexp_constructor, 2,
                                   ctx->class_proto[JS_CLASS_REGEXP]);
    ctx->regexp_ctor = JS_DupValue(ctx, obj);
    JS_SetPropertyFunctionList(ctx, obj, js_regexp_funcs, countof(js_regexp_funcs));

    ctx->class_proto[JS_CLASS_REGEXP_STRING_ITERATOR] =
        JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_REGEXP_STRING_ITERATOR],
                               js_regexp_string_iterator_proto_funcs,
                               countof(js_regexp_string_iterator_proto_funcs));
}